

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlSchemaPtr ctxt_00;
  int iVar1;
  xmlAttrPtr attr_00;
  xmlSchemaTypePtr type;
  xmlSchemaAnnotPtr pxVar2;
  _xmlNode *p_Var3;
  xmlChar *local_48;
  xmlChar *name;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaModelGroupDefPtr item;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  attr = (xmlAttrPtr)0x0;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    item = (xmlSchemaModelGroupDefPtr)node;
    node_local = (xmlNodePtr)schema;
    schema_local = (xmlSchemaPtr)ctxt;
    attr_00 = xmlSchemaGetPropNode(node,"name");
    ctxt_00 = schema_local;
    name = (xmlChar *)attr_00;
    if (attr_00 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
                 (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)item,"name",(char *)0x0);
      ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
    }
    else {
      type = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
      iVar1 = xmlSchemaPValAttrNode
                        ((xmlSchemaParserCtxtPtr)ctxt_00,(xmlSchemaBasicItemPtr)0x0,attr_00,type,
                         &local_48);
      if (iVar1 == 0) {
        child = (xmlNodePtr)
                xmlSchemaAddModelGroupDefinition
                          ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,local_48,
                           (xmlChar *)schema_local[1].annot,(xmlNodePtr)item);
        if (child == (xmlNodePtr)0x0) {
          ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
        }
        else {
          for (name = (xmlChar *)item[1].children; name != (xmlChar *)0x0;
              name = *(xmlChar **)(name + 0x30)) {
            if (*(long *)(name + 0x48) == 0) {
              iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),"name");
              if ((iVar1 == 0) && (iVar1 = xmlStrEqual(*(xmlChar **)(name + 0x10),"id"), iVar1 == 0)
                 ) {
                xmlSchemaPIllegalAttrErr
                          ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                           (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)name);
              }
            }
            else {
              iVar1 = xmlStrEqual(*(xmlChar **)(*(long *)(name + 0x48) + 0x10),xmlSchemaNs);
              if (iVar1 != 0) {
                xmlSchemaPIllegalAttrErr
                          ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                           (xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)name);
              }
            }
          }
          xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)item,"id");
          attr = (xmlAttrPtr)item->children;
          if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
             ((iVar1 = xmlStrEqual(attr->name,(xmlChar *)"annotation"), iVar1 != 0 &&
              (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)))) {
            pxVar2 = xmlSchemaParseAnnotation
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,1);
            *(xmlSchemaAnnotPtr *)&child->type = pxVar2;
            attr = attr->next;
          }
          if ((((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
              (iVar1 = xmlStrEqual(attr->name,"all"), iVar1 == 0)) ||
             (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 == 0)) {
            if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
               ((iVar1 = xmlStrEqual(attr->name,(xmlChar *)"choice"), iVar1 == 0 ||
                (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 == 0)))) {
              if ((((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
                  (iVar1 = xmlStrEqual(attr->name,(xmlChar *)"sequence"), iVar1 != 0)) &&
                 (iVar1 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar1 != 0)) {
                p_Var3 = (_xmlNode *)
                         xmlSchemaParseModelGroup
                                   ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                    (xmlNodePtr)attr,XML_SCHEMA_TYPE_SEQUENCE,0);
                child->children = p_Var3;
                attr = attr->next;
              }
            }
            else {
              p_Var3 = (_xmlNode *)
                       xmlSchemaParseModelGroup
                                 ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                  (xmlNodePtr)attr,XML_SCHEMA_TYPE_CHOICE,0);
              child->children = p_Var3;
              attr = attr->next;
            }
          }
          else {
            p_Var3 = (_xmlNode *)
                     xmlSchemaParseModelGroup
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                (xmlNodePtr)attr,XML_SCHEMA_TYPE_ALL,0);
            child->children = p_Var3;
            attr = attr->next;
          }
          if (attr != (xmlAttrPtr)0x0) {
            xmlSchemaPContentErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                       (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)item,(xmlNodePtr)attr,(char *)0x0,
                       "(annotation?, (all | choice | sequence)?)");
          }
          ctxt_local = (xmlSchemaParserCtxtPtr)child;
        }
      }
      else {
        ctxt_local = (xmlSchemaParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlSchemaModelGroupDefPtr)ctxt_local;
}

Assistant:

static xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlNodePtr node)
{
    xmlSchemaModelGroupDefPtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *name;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node,
	    "name", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    item = xmlSchemaAddModelGroupDefinition(ctxt, schema, name,
	ctxt->targetNamespace, node);
    if (item == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (IS_SCHEMA(child, "all")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_ALL, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "choice")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_CHOICE, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "sequence")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SEQUENCE, 0);
	child = child->next;
    }



    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (all | choice | sequence)?)");
    }
    return (item);
}